

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama.cpp
# Opt level: O3

llama_model *
llama_model_load_from_file_impl
          (string *path_model,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *splits,llama_model_params params)

{
  pointer ppgVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  llama_model *this;
  ggml_backend_device *pgVar5;
  ulong uVar6;
  pointer *pppgVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  size_t i;
  iterator iVar11;
  vector<ggml_backend_device*,std::allocator<ggml_backend_device*>> *this_00;
  ulong uVar12;
  char *__end;
  ggml_backend_dev_t *dev;
  ggml_backend_dev_t *__args;
  pointer ppgVar13;
  uint cur_percentage;
  time_meas tm;
  ggml_backend_dev_t main_gpu;
  ggml_backend_device **local_1f8;
  pointer ppgStack_1f0;
  ggml_backend_device **local_1e8;
  ggml_backend_device *local_1d0 [4];
  undefined4 local_1ac;
  vector<ggml_backend_device*,std::allocator<ggml_backend_device*>> *local_1a8;
  string *local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_198;
  pointer *local_190;
  time_meas local_188;
  undefined1 local_178 [16];
  uint64_t local_168;
  vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
  local_150;
  vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
  local_130;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
  local_118;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_e8;
  unique_ptr<gguf_context,_gguf_context_deleter> local_a8;
  vector<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  local_a0;
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78 [3];
  pointer local_48;
  pointer local_38;
  
  ggml_time_init();
  local_1ac = 0;
  if (params.progress_callback == (llama_progress_callback)0x0) {
    params.progress_callback_user_data = &local_1ac;
    params.progress_callback = llama_model_load_from_file_impl::anon_class_1_0_00000001::__invoke;
  }
  this = (llama_model *)operator_new(0x1ac0);
  llama_model::llama_model(this,&params);
  local_1a0 = path_model;
  local_198 = splits;
  if (params.devices == (ggml_backend_dev_t *)0x0) {
    local_1f8 = (ggml_backend_device **)0x0;
    ppgStack_1f0 = (ggml_backend_device **)0x0;
    local_1e8 = (ggml_backend_device **)0x0;
    local_190 = &(this->devices).
                 super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    local_1a8 = (vector<ggml_backend_device*,std::allocator<ggml_backend_device*>> *)&this->devices;
    for (uVar12 = 0; uVar6 = ggml_backend_dev_count(), uVar12 < uVar6; uVar12 = uVar12 + 1) {
      local_1d0[0] = (ggml_backend_device *)ggml_backend_dev_get(uVar12);
      iVar4 = ggml_backend_dev_type(local_1d0[0]);
      if (iVar4 == 1) {
        uVar8 = ggml_backend_dev_backend_reg(local_1d0[0]);
        ggml_backend_reg_name(uVar8);
        local_178._0_8_ = (ggml_backend_device *)&local_168;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"RPC","");
        iVar4 = std::__cxx11::string::compare((char *)local_178);
        if ((ggml_backend_device *)local_178._0_8_ != (ggml_backend_device *)&local_168) {
          operator_delete((void *)local_178._0_8_,local_168 + 1);
        }
        if (iVar4 == 0) {
          if (ppgStack_1f0 == local_1e8) {
            iVar11._M_current = ppgStack_1f0;
            this_00 = (vector<ggml_backend_device*,std::allocator<ggml_backend_device*>> *)
                      &local_1f8;
            goto LAB_001807b1;
          }
          *ppgStack_1f0 = local_1d0[0];
          pppgVar7 = &ppgStack_1f0;
        }
        else {
          iVar11._M_current =
               (this->devices).
               super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          this_00 = local_1a8;
          if (iVar11._M_current ==
              (this->devices).
              super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_001807b1:
            std::vector<ggml_backend_device*,std::allocator<ggml_backend_device*>>::
            _M_realloc_insert<ggml_backend_device*const&>(this_00,iVar11,local_1d0);
            goto LAB_001807bb;
          }
          *iVar11._M_current = local_1d0[0];
          pppgVar7 = local_190;
        }
        *pppgVar7 = *pppgVar7 + 1;
      }
LAB_001807bb:
    }
    if (local_1f8 != ppgStack_1f0) {
      std::vector<ggml_backend_device*,std::allocator<ggml_backend_device*>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<ggml_backend_device**,std::vector<ggml_backend_device*,std::allocator<ggml_backend_device*>>>>
                (local_1a8,*(undefined8 *)local_1a8);
    }
    if (local_1f8 != (ggml_backend_device **)0x0) {
      operator_delete(local_1f8,(long)local_1e8 - (long)local_1f8);
    }
  }
  else {
    pgVar5 = *params.devices;
    if (pgVar5 != (ggml_backend_device *)0x0) {
      __args = params.devices;
      do {
        iVar11._M_current =
             (this->devices).
             super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar11._M_current ==
            (this->devices).
            super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<ggml_backend_device*,std::allocator<ggml_backend_device*>>::
          _M_realloc_insert<ggml_backend_device*const&>
                    ((vector<ggml_backend_device*,std::allocator<ggml_backend_device*>> *)
                     &this->devices,iVar11,__args);
        }
        else {
          *iVar11._M_current = pgVar5;
          pppgVar7 = &(this->devices).
                      super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppgVar7 = *pppgVar7 + 1;
        }
        pgVar5 = __args[1];
        __args = __args + 1;
      } while (pgVar5 != (ggml_backend_device *)0x0);
    }
  }
  if (params.split_mode == LLAMA_SPLIT_MODE_NONE) {
    lVar10 = (long)params.main_gpu;
    if (lVar10 < 0) {
      uVar12 = (ulong)((long)(this->devices).
                             super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->devices).
                            super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3;
    }
    else {
      ppgVar13 = (this->devices).
                 super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      iVar11._M_current =
           (this->devices).
           super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>._M_impl
           .super__Vector_impl_data._M_finish;
      uVar12 = (ulong)((long)iVar11._M_current - (long)ppgVar13) >> 3;
      if (params.main_gpu < (int)uVar12) {
        local_178._0_8_ = ppgVar13[lVar10];
        if (iVar11._M_current != ppgVar13) {
          (this->devices).
          super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>._M_impl.
          super__Vector_impl_data._M_finish = ppgVar13;
          iVar11._M_current = ppgVar13;
        }
        if (iVar11._M_current ==
            (this->devices).
            super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<ggml_backend_device*,std::allocator<ggml_backend_device*>>::
          _M_realloc_insert<ggml_backend_device*const&>
                    ((vector<ggml_backend_device*,std::allocator<ggml_backend_device*>> *)
                     &this->devices,iVar11,(ggml_backend_device **)local_178);
        }
        else {
          *iVar11._M_current = (ggml_backend_device *)local_178._0_8_;
          pppgVar7 = &(this->devices).
                      super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppgVar7 = *pppgVar7 + 1;
        }
        goto LAB_0018080b;
      }
    }
    llama_log_internal(GGML_LOG_LEVEL_ERROR,
                       "%s: invalid value for main_gpu: %d (available devices: %d)\n",
                       "llama_model_load_from_file_impl",lVar10,uVar12);
  }
  else {
LAB_0018080b:
    ppgVar1 = (this->devices).
              super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppgVar13 = (this->devices).
                    super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppgVar13 != ppgVar1;
        ppgVar13 = ppgVar13 + 1) {
      pgVar5 = *ppgVar13;
      ggml_backend_dev_memory(pgVar5,local_178,&local_1f8);
      uVar8 = ggml_backend_dev_name(pgVar5);
      uVar9 = ggml_backend_dev_description(pgVar5);
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: using device %s (%s) - %zu MiB free\n",
                         "llama_model_load_from_file_impl",uVar8,uVar9,
                         (ulong)local_178._0_8_ >> 0x14);
    }
    this->t_load_us = 0;
    time_meas::time_meas(&local_188,&this->t_load_us,false);
    this->t_start_us = local_188.t_start_us;
    llama_model_loader::llama_model_loader
              ((llama_model_loader *)local_178,local_1a0,local_198,params.use_mmap,
               params.check_tensors,params.kv_overrides,params.tensor_buft_overrides);
    llama_model_loader::print_info((llama_model_loader *)local_178);
    (this->hparams).vocab_only = params.vocab_only;
    llama_model::load_arch(this,(llama_model_loader *)local_178);
    llama_model::load_hparams(this,(llama_model_loader *)local_178);
    llama_model::load_vocab(this,(llama_model_loader *)local_178);
    llama_model::load_stats(this,(llama_model_loader *)local_178);
    llama_model::print_info(this);
    bVar2 = params.vocab_only;
    if (params.vocab_only == true) {
      bVar3 = false;
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: vocab only - skipping tensors\n",
                         "llama_model_load");
    }
    else {
      bVar3 = llama_model::load_tensors(this,(llama_model_loader *)local_178);
    }
    if (local_48 != (pointer)0x0) {
      operator_delete(local_48,(long)local_38 - (long)local_48);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_p != local_78) {
      operator_delete(local_88._M_p,local_78[0]._M_allocated_capacity + 1);
    }
    std::
    vector<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
    ::~vector(&local_a0);
    std::unique_ptr<gguf_context,_gguf_context_deleter>::~unique_ptr(&local_a8);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_kv_override>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_e8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
    ::~_Rb_tree(&local_118);
    std::
    vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
    ::~vector(&local_130);
    std::
    vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
    ::~vector(&local_150);
    time_meas::~time_meas(&local_188);
    if (bVar3 != false || bVar2 != false) {
      return this;
    }
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: cancelled model load\n",
                       "llama_model_load_from_file_impl");
  }
  llama_model_free(this);
  return (llama_model *)0x0;
}

Assistant:

static struct llama_model * llama_model_load_from_file_impl(
        const std::string & path_model,
        std::vector<std::string> & splits,
        struct llama_model_params params) {
    ggml_time_init();

    unsigned cur_percentage = 0;
    if (params.progress_callback == NULL) {
        params.progress_callback_user_data = &cur_percentage;
        params.progress_callback = [](float progress, void * ctx) {
            unsigned * cur_percentage_p = (unsigned *) ctx;
            unsigned percentage = (unsigned) (100 * progress);
            while (percentage > *cur_percentage_p) {
                *cur_percentage_p = percentage;
                LLAMA_LOG_CONT(".");
                if (percentage >= 100) {
                    LLAMA_LOG_CONT("\n");
                }
            }
            return true;
        };
    }

    llama_model * model = new llama_model(params);

    // create list of devices to use with this model
    if (params.devices) {
        for (ggml_backend_dev_t * dev = params.devices; *dev; ++dev) {
            model->devices.push_back(*dev);
        }
    } else {
        std::vector<ggml_backend_dev_t> rpc_servers;
        // use all available devices
        for (size_t i = 0; i < ggml_backend_dev_count(); ++i) {
            ggml_backend_dev_t dev = ggml_backend_dev_get(i);
            switch (ggml_backend_dev_type(dev)) {
                case GGML_BACKEND_DEVICE_TYPE_CPU:
                case GGML_BACKEND_DEVICE_TYPE_ACCEL:
                    // skip CPU backends since they are handled separately
                    break;

                case GGML_BACKEND_DEVICE_TYPE_GPU:
                    ggml_backend_reg_t reg = ggml_backend_dev_backend_reg(dev);
                    if (ggml_backend_reg_name(reg) == std::string("RPC")) {
                        rpc_servers.push_back(dev);
                    } else {
                        model->devices.push_back(dev);
                    }
                    break;
            }
        }
        // add RPC servers at the front of the list
        if (!rpc_servers.empty()) {
            model->devices.insert(model->devices.begin(), rpc_servers.begin(), rpc_servers.end());
        }
    }

    // if using single GPU mode, remove all except the main GPU
    if (params.split_mode == LLAMA_SPLIT_MODE_NONE) {
        if (params.main_gpu < 0 || params.main_gpu >= (int)model->devices.size()) {
            LLAMA_LOG_ERROR("%s: invalid value for main_gpu: %d (available devices: %d)\n", __func__, params.main_gpu, (int)model->devices.size());
            llama_model_free(model);
            return nullptr;
        }
        ggml_backend_dev_t main_gpu = model->devices[params.main_gpu];
        model->devices.clear();
        model->devices.push_back(main_gpu);
    }

    for (auto * dev : model->devices) {
        size_t free, total; // NOLINT
        ggml_backend_dev_memory(dev, &free, &total);
        LLAMA_LOG_INFO("%s: using device %s (%s) - %zu MiB free\n", __func__, ggml_backend_dev_name(dev), ggml_backend_dev_description(dev), free/1024/1024);
    }

    const int status = llama_model_load(path_model, splits, *model, params);
    GGML_ASSERT(status <= 0);
    if (status < 0) {
        if (status == -1) {
            LLAMA_LOG_ERROR("%s: failed to load model\n", __func__);
        } else if (status == -2) {
            LLAMA_LOG_INFO("%s: cancelled model load\n", __func__);
        }

        llama_model_free(model);
        return nullptr;
    }

    return model;
}